

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

uint16_t __thiscall capnp::DynamicEnum::asImpl(DynamicEnum *this,uint64_t requestedTypeId)

{
  bool bVar1;
  Fault local_88;
  Fault f;
  uint64_t local_50;
  unsigned_long *local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  uint64_t requestedTypeId_local;
  DynamicEnum *this_local;
  
  _kjCondition._32_8_ = requestedTypeId;
  local_48 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long *)&_kjCondition.result);
  Schema::getProto((Reader *)&f,(Schema *)this);
  local_50 = capnp::schema::Node::Reader::getId((Reader *)&f);
  kj::_::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_40,
             (DebugExpression<unsigned_long&> *)&local_48,&local_50);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[35]>
              (&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x78,FAILED,"requestedTypeId == schema.getProto().getId()",
               "_kjCondition,\"Type mismatch in DynamicEnum.as().\"",
               (DebugComparison<unsigned_long_&,_unsigned_long> *)local_40,
               (char (*) [35])"Type mismatch in DynamicEnum.as().");
    kj::_::Debug::Fault::~Fault(&local_88);
  }
  return this->value;
}

Assistant:

uint16_t DynamicEnum::asImpl(uint64_t requestedTypeId) const {
  KJ_REQUIRE(requestedTypeId == schema.getProto().getId(),
             "Type mismatch in DynamicEnum.as().") {
    // use it anyway
    break;
  }
  return value;
}